

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
* read_neighbors_abi_cxx11_(xml_node<char> *root_node)

{
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *in_RDI;
  uint right_orientation;
  string right_tile;
  size_type right_delimiter;
  string right;
  uint left_orientation;
  string left_tile;
  size_type left_delimiter;
  string left;
  xml_node<char> *node;
  xml_node<char> *neighbor_node;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *neighbors;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  xml_node<char> *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  undefined8 in_stack_fffffffffffffdd0;
  undefined1 uVar1;
  string *this;
  size_t in_stack_fffffffffffffdd8;
  string *xmlns_size;
  size_t in_stack_fffffffffffffde0;
  size_t name_size;
  char *in_stack_fffffffffffffde8;
  xml_node<char> *xmlns;
  string *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  string local_168 [36];
  int local_144;
  string local_140 [32];
  long local_120;
  undefined1 local_111 [33];
  string local_f0 [32];
  string local_d0 [36];
  int local_ac;
  string local_a8 [32];
  long local_88;
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  xml_node<char> *local_38;
  xml_node<char> *local_20;
  undefined1 local_11;
  
  uVar1 = (undefined1)((ulong)in_stack_fffffffffffffdd0 >> 0x38);
  local_11 = 0;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)0x10d874);
  local_20 = rapidxml::xml_node<char>::first_node
                       ((xml_node<char> *)
                        CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                        (char *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(bool)uVar1);
  local_38 = rapidxml::xml_node<char>::first_node
                       ((xml_node<char> *)
                        CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                        (char *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(bool)uVar1);
  while (local_38 != (xml_node<char> *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"left",&local_79);
    rapidxml::get_attribute
              ((xml_node<char> *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
               in_stack_fffffffffffffdf0);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    local_88 = std::__cxx11::string::find((char *)local_58,0x14fea9);
    std::__cxx11::string::substr((ulong)local_a8,(ulong)local_58);
    local_ac = 0;
    if (local_88 != -1) {
      std::__cxx11::string::substr((ulong)local_d0,(ulong)local_58);
      in_stack_fffffffffffffdfc =
           std::__cxx11::stoi((string *)in_stack_fffffffffffffdc0,
                              (size_t *)in_stack_fffffffffffffdb8,0);
      local_ac = in_stack_fffffffffffffdfc;
      std::__cxx11::string::~string(local_d0);
    }
    in_stack_fffffffffffffdf0 = (string *)local_111;
    xmlns = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_111 + 1),"right",(allocator *)in_stack_fffffffffffffdf0);
    xmlns_size = local_f0;
    this = (string *)(local_111 + 1);
    rapidxml::get_attribute
              ((xml_node<char> *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
               in_stack_fffffffffffffdf0);
    std::__cxx11::string::~string(this);
    std::allocator<char>::~allocator((allocator<char> *)local_111);
    name_size = 0;
    local_120 = std::__cxx11::string::find((char *)xmlns_size,0x14fea9);
    std::__cxx11::string::substr((ulong)local_140,(ulong)xmlns_size);
    local_144 = 0;
    if (local_120 != -1) {
      std::__cxx11::string::substr((ulong)local_168,(ulong)local_f0);
      in_stack_fffffffffffffdcc =
           std::__cxx11::stoi((string *)in_stack_fffffffffffffdc0,
                              (size_t *)in_stack_fffffffffffffdb8,0);
      local_144 = in_stack_fffffffffffffdcc;
      std::__cxx11::string::~string(local_168);
    }
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int_&,_true,_true>
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               (uint *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(uint *)0x10dc9c);
    uVar1 = (undefined1)((ulong)this >> 0x38);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::push_back((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)in_stack_fffffffffffffdc0,(value_type *)in_stack_fffffffffffffdb8);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)0x10dcbf);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_58);
    in_stack_fffffffffffffdc0 =
         rapidxml::xml_node<char>::next_sibling
                   ((xml_node<char> *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                    (char *)in_stack_fffffffffffffdf0,(char *)xmlns,name_size,(size_t)xmlns_size,
                    (bool)uVar1);
    local_38 = in_stack_fffffffffffffdc0;
  }
  return in_RDI;
}

Assistant:

vector<tuple<string, unsigned, string, unsigned>>
read_neighbors(xml_node<> *root_node) {
  vector<tuple<string, unsigned, string, unsigned>> neighbors;
  xml_node<> *neighbor_node = root_node->first_node("neighbors");
  for (xml_node<> *node = neighbor_node->first_node("neighbor"); node;
       node = node->next_sibling("neighbor")) {
    string left = rapidxml::get_attribute(node, "left");
    string::size_type left_delimiter = left.find(" ");
    string left_tile = left.substr(0, left_delimiter);
    unsigned left_orientation = 0;
    if (left_delimiter != string::npos) {
      left_orientation = stoi(left.substr(left_delimiter, string::npos));
    }

    string right = rapidxml::get_attribute(node, "right");
    string::size_type right_delimiter = right.find(" ");
    string right_tile = right.substr(0, right_delimiter);
    unsigned right_orientation = 0;
    if (right_delimiter != string::npos) {
      right_orientation = stoi(right.substr(right_delimiter, string::npos));
    }
    neighbors.push_back(
        {left_tile, left_orientation, right_tile, right_orientation});
  }
  return neighbors;
}